

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qformlayout.cpp
# Opt level: O1

bool __thiscall QFormLayout::isRowVisible(QFormLayout *this,int row)

{
  long lVar1;
  QFormLayoutItem *this_00;
  QFormLayoutItem *this_01;
  bool bVar2;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  lVar1 = *(long *)(*(long *)&(this->super_QLayout).field_0x8 + 200);
  this_00 = *(QFormLayoutItem **)(lVar1 + (long)(row * 2) * 8);
  this_01 = *(QFormLayoutItem **)(lVar1 + (long)(row * 2 + 1) * 8);
  if ((this_00 != (QFormLayoutItem *)0x0) && (bVar2 = QFormLayoutItem::isHidden(this_00), !bVar2)) {
    iVar4 = (*this_00->item->_vptr_QLayoutItem[0xd])();
    bVar2 = true;
    if ((CONCAT44(extraout_var,iVar4) == 0) ||
       (iVar4 = (*this_00->item->_vptr_QLayoutItem[0xd])(),
       (*(byte *)(*(long *)(CONCAT44(extraout_var_00,iVar4) + 0x20) + 10) & 1) == 0))
    goto LAB_003a01aa;
  }
  bVar2 = false;
LAB_003a01aa:
  if ((this_01 != (QFormLayoutItem *)0x0) && (bVar3 = QFormLayoutItem::isHidden(this_01), !bVar3)) {
    iVar4 = (*this_01->item->_vptr_QLayoutItem[0xd])();
    if (CONCAT44(extraout_var_01,iVar4) == 0) {
      return true;
    }
    iVar4 = (*this_01->item->_vptr_QLayoutItem[0xd])();
    if ((*(byte *)(*(long *)(CONCAT44(extraout_var_02,iVar4) + 0x20) + 10) & 1) == 0) {
      return true;
    }
  }
  return bVar2;
}

Assistant:

bool QFormLayout::isRowVisible(int row) const
{
    Q_D(const QFormLayout);
    QFormLayoutItem *label = d->m_matrix(row, 0);
    QFormLayoutItem *field = d->m_matrix(row, 1);

    int visibleItemCount = 2;
    if (!label || label->isHidden() || (label->widget() && label->widget()->isHidden()))
        --visibleItemCount;
    if (!field || field->isHidden() || (field->widget() && field->widget()->isHidden()))
        --visibleItemCount;

    return visibleItemCount > 0;
}